

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

int __thiscall DLevelScript::DoClassifyActor(DLevelScript *this,int tid)

{
  player_t *ppVar1;
  DBot *pDVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  APlayerPawn *pAVar6;
  
  if (tid == 0) {
    pAVar6 = (APlayerPawn *)(this->activator).field_0.p;
    if ((pAVar6 != (APlayerPawn *)0x0) &&
       (((pAVar6->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
      (this->activator).field_0.p = (AActor *)0x0;
      pAVar6 = (APlayerPawn *)0x0;
    }
    if (pAVar6 == (APlayerPawn *)0x0) {
      return 1;
    }
  }
  else {
    for (pAVar6 = (APlayerPawn *)AActor::TIDHash[tid & 0x7f];
        (pAVar6 != (APlayerPawn *)0x0 && ((pAVar6->super_AActor).tid != tid));
        pAVar6 = (APlayerPawn *)(pAVar6->super_AActor).inext) {
    }
  }
  if (pAVar6 == (APlayerPawn *)0x0) {
    return 0;
  }
  ppVar1 = (pAVar6->super_AActor).player;
  if (ppVar1 != (player_t *)0x0) {
    uVar5 = (uint)(ppVar1->playerstate == '\x01') * 0x20 + (uint)(ppVar1->mo != pAVar6) * 8 + 0x22;
    pDVar2 = (ppVar1->Bot).field_0.p;
    bVar3 = true;
    if (pDVar2 != (DBot *)0x0) {
      if (((pDVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
        bVar3 = false;
      }
      else {
        (ppVar1->Bot).field_0.p = (DBot *)0x0;
      }
    }
    uVar4 = uVar5 | 4;
    if (bVar3) {
      uVar4 = uVar5;
    }
    return uVar4;
  }
  if (((pAVar6->super_AActor).flags3.Value & 0x2000) == 0) {
    return (uint)(((pAVar6->super_AActor).flags.Value & 0x10000) == 0) * 0x80 + 0x80;
  }
  return (uint)((pAVar6->super_AActor).health < 1) * 0x20 + 0x30;
}

Assistant:

int DLevelScript::DoClassifyActor(int tid)
{
	AActor *actor;
	int classify;

	if (tid == 0)
	{
		actor = activator;
		if (actor == NULL)
		{
			return ACTOR_WORLD;
		}
	}
	else
	{
		FActorIterator it(tid);
		actor = it.Next();
	}
	if (actor == NULL)
	{
		return ACTOR_NONE;
	}

	classify = 0;
	if (actor->player != NULL)
	{
		classify |= ACTOR_PLAYER;
		if (actor->player->playerstate == PST_DEAD)
		{
			classify |= ACTOR_DEAD;
		}
		else
		{
			classify |= ACTOR_ALIVE;
		}
		if (actor->player->mo != actor)
		{
			classify |= ACTOR_VOODOODOLL;
		}
		if (actor->player->Bot != NULL)
		{
			classify |= ACTOR_BOT;
		}
	}
	else if (actor->flags3 & MF3_ISMONSTER)
	{
		classify |= ACTOR_MONSTER;
		if (actor->health <= 0)
		{
			classify |= ACTOR_DEAD;
		}
		else
		{
			classify |= ACTOR_ALIVE;
		}
	}
	else if (actor->flags & MF_MISSILE)
	{
		classify |= ACTOR_MISSILE;
	}
	else
	{
		classify |= ACTOR_GENERIC;
	}
	return classify;
}